

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O3

void __thiscall
icu_63::CjkBreakEngine::CjkBreakEngine
          (CjkBreakEngine *this,DictionaryMatcher *adoptDictionary,LanguageType type,
          UErrorCode *status)

{
  UnicodeSet *this_00;
  UnicodeSet *this_01;
  UnicodeSet *this_02;
  UnicodeSet *this_03;
  Normalizer2 *pNVar1;
  UnicodeSet cjSet;
  ConstChar16Ptr local_e8;
  ConstChar16Ptr local_e0;
  ConstChar16Ptr local_d8;
  ConstChar16Ptr local_d0;
  UnicodeSet local_c8;
  char16_t *local_70;
  char16_t *local_60;
  char16_t *local_50;
  char16_t *local_40;
  
  DictionaryBreakEngine::DictionaryBreakEngine(&this->super_DictionaryBreakEngine);
  (this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine =
       (_func_int **)&PTR__CjkBreakEngine_0024b090;
  this_00 = &this->fHangulWordSet;
  UnicodeSet::UnicodeSet(this_00);
  this_01 = &this->fHanWordSet;
  UnicodeSet::UnicodeSet(this_01);
  this_02 = &this->fKatakanaWordSet;
  UnicodeSet::UnicodeSet(this_02);
  this_03 = &this->fHiraganaWordSet;
  UnicodeSet::UnicodeSet(this_03);
  this->fDictionary = adoptDictionary;
  local_d0.p_ = L"[\\uac00-\\ud7a3]";
  UnicodeString::UnicodeString((UnicodeString *)&local_c8,'\x01',&local_d0,-1);
  UnicodeSet::applyPattern(this_00,(UnicodeString *)&local_c8,status);
  UnicodeString::~UnicodeString((UnicodeString *)&local_c8);
  local_40 = local_d0.p_;
  local_d8.p_ = L"[:Han:]";
  UnicodeString::UnicodeString((UnicodeString *)&local_c8,'\x01',&local_d8,-1);
  UnicodeSet::applyPattern(this_01,(UnicodeString *)&local_c8,status);
  UnicodeString::~UnicodeString((UnicodeString *)&local_c8);
  local_50 = local_d8.p_;
  local_e0.p_ = L"[[:Katakana:]\\uff9e\\uff9f]";
  UnicodeString::UnicodeString((UnicodeString *)&local_c8,'\x01',&local_e0,-1);
  UnicodeSet::applyPattern(this_02,(UnicodeString *)&local_c8,status);
  UnicodeString::~UnicodeString((UnicodeString *)&local_c8);
  local_60 = local_e0.p_;
  local_e8.p_ = L"[:Hiragana:]";
  UnicodeString::UnicodeString((UnicodeString *)&local_c8,'\x01',&local_e8,-1);
  UnicodeSet::applyPattern(this_03,(UnicodeString *)&local_c8,status);
  UnicodeString::~UnicodeString((UnicodeString *)&local_c8);
  local_70 = local_e8.p_;
  pNVar1 = Normalizer2::getNFKCInstance(status);
  this->nfkcNorm2 = pNVar1;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (type == kKorean) {
      (*(this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine[4])
                (this,this_00);
    }
    else {
      UnicodeSet::UnicodeSet(&local_c8);
      UnicodeSet::addAll(&local_c8,this_01);
      UnicodeSet::addAll(&local_c8,this_02);
      UnicodeSet::addAll(&local_c8,this_03);
      UnicodeSet::add(&local_c8,0xff70);
      UnicodeSet::add(&local_c8,0x30fc);
      (*(this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine[4])
                (this,&local_c8);
      UnicodeSet::~UnicodeSet(&local_c8);
    }
  }
  return;
}

Assistant:

CjkBreakEngine::CjkBreakEngine(DictionaryMatcher *adoptDictionary, LanguageType type, UErrorCode &status)
: DictionaryBreakEngine(), fDictionary(adoptDictionary) {
    // Korean dictionary only includes Hangul syllables
    fHangulWordSet.applyPattern(UNICODE_STRING_SIMPLE("[\\uac00-\\ud7a3]"), status);
    fHanWordSet.applyPattern(UNICODE_STRING_SIMPLE("[:Han:]"), status);
    fKatakanaWordSet.applyPattern(UNICODE_STRING_SIMPLE("[[:Katakana:]\\uff9e\\uff9f]"), status);
    fHiraganaWordSet.applyPattern(UNICODE_STRING_SIMPLE("[:Hiragana:]"), status);
    nfkcNorm2 = Normalizer2::getNFKCInstance(status);

    if (U_SUCCESS(status)) {
        // handle Korean and Japanese/Chinese using different dictionaries
        if (type == kKorean) {
            setCharacters(fHangulWordSet);
        } else { //Chinese and Japanese
            UnicodeSet cjSet;
            cjSet.addAll(fHanWordSet);
            cjSet.addAll(fKatakanaWordSet);
            cjSet.addAll(fHiraganaWordSet);
            cjSet.add(0xFF70); // HALFWIDTH KATAKANA-HIRAGANA PROLONGED SOUND MARK
            cjSet.add(0x30FC); // KATAKANA-HIRAGANA PROLONGED SOUND MARK
            setCharacters(cjSet);
        }
    }
}